

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::TimingControlStatementSyntax::setChild
          (TimingControlStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  SyntaxNode *pSVar2;
  logic_error *this_00;
  StatementSyntax *local_148;
  TimingControlSyntax *local_140;
  NamedLabelSyntax *local_138;
  string local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  StatementSyntax *local_38;
  StatementSyntax *local_30;
  TimingControlSyntax *local_28;
  TimingControlSyntax *local_20;
  size_t local_18;
  size_t index_local;
  TimingControlStatementSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_138 = (NamedLabelSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_138 = SyntaxNode::as<slang::syntax::NamedLabelSyntax>(pSVar2);
    }
    (this->super_StatementSyntax).label = local_138;
    break;
  case 1:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar2);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (&(this->super_StatementSyntax).attributes,pSVar1);
    break;
  case 2:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_140 = (TimingControlSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_140 = SyntaxNode::as<slang::syntax::TimingControlSyntax>(pSVar2);
    }
    local_28 = local_140;
    not_null<slang::syntax::TimingControlSyntax*>::
    not_null<slang::syntax::TimingControlSyntax*,void>
              ((not_null<slang::syntax::TimingControlSyntax*> *)&local_20,&local_28);
    (this->timingControl).ptr = local_20;
    break;
  case 3:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_148 = (StatementSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_148 = SyntaxNode::as<slang::syntax::StatementSyntax>(pSVar2);
    }
    local_38 = local_148;
    not_null<slang::syntax::StatementSyntax*>::not_null<slang::syntax::StatementSyntax*,void>
              ((not_null<slang::syntax::StatementSyntax*> *)&local_30,&local_38);
    (this->statement).ptr = local_30;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_d9);
    std::operator+(&local_b8,&local_d8,":");
    std::__cxx11::to_string(&local_110,0x3228);
    std::operator+(&local_98,&local_b8,&local_110);
    std::operator+(&local_78,&local_98,": ");
    std::operator+(&local_58,&local_78,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_58);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void TimingControlStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: timingControl = child.node() ? &child.node()->as<TimingControlSyntax>() : nullptr; return;
        case 3: statement = child.node() ? &child.node()->as<StatementSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}